

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_serialization_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uniform_int_distribution<int> *__param;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  result_type rVar4;
  size_t __i;
  anon_struct_24_3_668335fe_for_anon_union_5000_2_650ea050_for_random_device_0_0 *__a;
  long lVar5;
  undefined1 *__nbytes;
  void *__buf;
  void *__buf_00;
  ulong uVar6;
  size_t sVar7;
  param_type begin;
  param_type end;
  ulong uVar8;
  initializer_list<unsigned_char> __l;
  undefined1 local_2aa0 [8];
  random_device rdev;
  mt19937 rgen;
  ifstream binData;
  int aiStack_370 [122];
  undefined1 local_188 [8];
  ApplicationXimuReader oneQuaternionReader;
  ApplicationXimuReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedQuaternion;
  string file;
  uniform_int_distribution<int> dist;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  uchar local_31 [8];
  uchar chr;
  
  ximu::ReaderBase::ReaderBase((ReaderBase *)local_188);
  local_188 = (undefined1  [8])&PTR_recievedQuaternionData_0010bcc0;
  oneQuaternionReader.super_ReaderBase._maxBufferSize = 0;
  oneQuaternionReader._quatCount = 0;
  oneQuaternionReader._calInAndMagCount = 0;
  local_2aa0 = (undefined1  [8])0xa00300f106e1f05;
  rdev.field_0._M_mt._M_x[0]._0_4_ = 0x80485202;
  __a = &rdev.field_0.field_0 + 0xd0;
  __l._M_len = 0xc;
  __l._M_array = local_2aa0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reader._digitalIOCount,__l,
             (allocator_type *)__a);
  sVar7 = reader._digitalIOCount;
  ximu::ReaderBase::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ReaderBase *)local_188,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )reader._digitalIOCount,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ximu::ReaderBase::read((ReaderBase *)local_188,(int)sVar7,__buf,(size_t)__a);
  uVar3 = 1;
  if (oneQuaternionReader.super_ReaderBase._maxBufferSize == 1) {
    ximu::ReaderBase::ReaderBase((ReaderBase *)&oneQuaternionReader._digitalIOCount);
    oneQuaternionReader._digitalIOCount = (size_t)&PTR_recievedQuaternionData_0010bcc0;
    reader.super_ReaderBase._maxBufferSize = 0;
    reader._quatCount = 0;
    reader._calInAndMagCount = 0;
    encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&file._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"ximu.dmp","");
    dist._M_param._M_a = 0;
    dist._M_param._M_b = 0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::ifstream::ifstream
              (&rgen._M_p,
               (char *)encodedQuaternion.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,_S_in|_S_bin);
    local_31[0] = std::istream::get();
    while( true ) {
      if (*(int *)((long)aiStack_370 + *(long *)(rgen._M_p - 0x18)) != 0) break;
      if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dist,(iterator)0x0,
                   local_31);
      }
      else {
        *bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = local_31[0];
        bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_31[0] = std::istream::get();
    }
    uVar6 = (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)dist._M_param;
    std::random_device::random_device((random_device *)local_2aa0);
    uVar3 = std::random_device::_M_getval();
    rdev.field_0._M_mt._M_p = (size_t)uVar3;
    lVar5 = 1;
    uVar8 = rdev.field_0._M_mt._M_p;
    do {
      uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar5);
      rgen._M_x[lVar5 + -1] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    rgen._M_x[0x26f] = 0x270;
    __nbytes = (undefined1 *)((long)&file.field_2 + 8);
    file.field_2._8_8_ = 0x6400000002;
    begin = dist._M_param;
    while (uVar6 != 0) {
      __param = (uniform_int_distribution<int> *)((long)&file.field_2 + 8);
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (__param,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                  *)((long)&rdev.field_0 + 0x1380),(param_type *)__param);
      uVar6 = uVar6 - (long)rVar4;
      uVar8 = (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)dist._M_param;
      end = (param_type)((long)rVar4 + (long)begin);
      if (uVar8 <= uVar6) {
        end = (param_type)
              bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      }
      ximu::ReaderBase::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((ReaderBase *)&oneQuaternionReader._digitalIOCount,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )begin,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )end);
      if (uVar8 <= uVar6) {
        uVar6 = 0;
      }
      ximu::ReaderBase::read
                ((ReaderBase *)&oneQuaternionReader._digitalIOCount,begin._M_a,__buf_00,
                 (size_t)__nbytes);
      begin = end;
    }
    bVar1 = reader._quatCount != 0x8d4;
    bVar2 = reader.super_ReaderBase._maxBufferSize != 0x235;
    std::random_device::_M_fini();
    std::ifstream::~ifstream(&rgen._M_p);
    if (dist._M_param != (param_type)0x0) {
      operator_delete((void *)dist._M_param);
    }
    if ((size_type *)
        encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != &file._M_string_length) {
      operator_delete(encodedQuaternion.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    uVar3 = (uint)(bVar1 || bVar2);
    oneQuaternionReader._digitalIOCount = (size_t)&PTR_recievedQuaternionData_0010bd38;
    std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
              ((_Deque_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reader);
  }
  if (reader._digitalIOCount != 0) {
    operator_delete((void *)reader._digitalIOCount);
  }
  local_188 = (undefined1  [8])&PTR_recievedQuaternionData_0010bd38;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            ((_Deque_base<unsigned_char,_std::allocator<unsigned_char>_> *)&oneQuaternionReader);
  return uVar3;
}

Assistant:

int main(int argc, char* argv[]) {

  /*
   * Testing one encoded quaternion
   */
  ApplicationXimuReader oneQuaternionReader;
  std::vector<unsigned char> encodedQuaternion = {5, 31, 110, 16, 15, 48, 0, 10, 2, 82, 72, 128 };
  oneQuaternionReader.fill(encodedQuaternion.begin(),encodedQuaternion.end());
  oneQuaternionReader.read();
  if (oneQuaternionReader.QuaternionCount() != 1)
      return 1;



  ApplicationXimuReader reader;

  std::string file("ximu.dmp");
  std::vector<unsigned char> bytes;

  // read the dump
  std::ifstream binData(file.c_str(), std::ios_base::in | std::ios::binary);
  unsigned char chr = binData.get();

  while (binData.good()) {
    bytes.push_back(chr);
    chr = binData.get();
  }
  size_t numBytes = bytes.size();

  // simulate a port
  std::random_device rdev;
  std::mt19937 rgen(rdev());

  // we are simulating recieving between 2 and a 100 bytes
  std::uniform_int_distribution<int> dist(2, 100);

  auto head = bytes.begin();
  auto tail = bytes.begin();
  while (numBytes > 0) {
    int steps = dist(rgen);
    if (numBytes - steps < bytes.size()) {
      head = tail;
      std::advance(tail, steps);
       numBytes -= steps;
    } else {
      head = tail;
      tail = bytes.end();
      numBytes = 0;
    }
    reader.fill(head, tail);
    reader.read();
  }

  // test the number of packets found
  // packet count has been confirmed with the c# verion.

  if (reader.QuaternionCount() != 565)
    return 1;

  if (reader.CalInertialAndMagneticDataCount() != 2260)
    return 1;
  return 0;
}